

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

void fdb_sync_db_header(fdb_kvs_handle *handle)

{
  uint64_t version;
  btree *pbVar1;
  bool bVar2;
  filemgr_header_revnum_t fVar3;
  fdb_seqnum_t fVar4;
  void *header_buf;
  __int_type _Var5;
  char *prev_filename;
  bid_t new_stale_root;
  bid_t new_seq_root;
  bid_t idtree_root;
  filemgr_header_revnum_t revnum;
  bid_t hdr_bid;
  char *compacted_filename;
  uint64_t dummy64;
  uint64_t header_flags;
  size_t header_len;
  
  fVar3 = filemgr_get_header_revnum(handle->file);
  if ((handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i == fVar3) {
    if (handle->fhandle->root == handle) {
      fVar4 = filemgr_get_seqnum(handle->file);
      handle->seqnum = fVar4;
    }
  }
  else {
    header_buf = filemgr_get_header(handle->file,(void *)0x0,&header_len,&hdr_bid,
                                    (fdb_seqnum_t *)0x0,&revnum);
    if (header_len == 0) {
      if ((handle->file->header).size == 0) {
        _Var5 = 0xffffffffffffffff;
      }
      else {
        _Var5 = (handle->file->header).bid.super___atomic_base<unsigned_long>._M_i;
      }
      LOCK();
      (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i = _Var5;
      UNLOCK();
    }
    else {
      prev_filename = (char *)0x0;
      version = handle->file->version;
      LOCK();
      (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i = hdr_bid;
      UNLOCK();
      LOCK();
      (handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i = revnum;
      UNLOCK();
      fdb_fetch_header(version,header_buf,&idtree_root,&new_seq_root,&new_stale_root,&dummy64,
                       &dummy64,&dummy64,&dummy64,&handle->last_wal_flush_hdr_bid,
                       &handle->kv_info_offset,&header_flags,&compacted_filename,&prev_filename);
      if (handle->dirty_updates != '\0') {
        btreeblk_discard_blocks(handle->bhandle);
      }
      handle->trie->root_bid = idtree_root;
      if ((handle->config).seqtree_opt == '\x01') {
        pbVar1 = (handle->field_6).seqtree;
        if (new_seq_root != pbVar1->root_bid) {
          if ((handle->config).multi_kv_instances == true) {
            pbVar1->root_bid = new_seq_root;
          }
          else {
            btree_init_from_bid(pbVar1,pbVar1->blk_handle,pbVar1->blk_ops,pbVar1->kv_ops,
                                pbVar1->blksize,new_seq_root);
          }
        }
      }
      bVar2 = ver_staletree_support(version);
      if (bVar2) {
        pbVar1 = handle->staletree;
        btree_init_from_bid(pbVar1,pbVar1->blk_handle,pbVar1->blk_ops,pbVar1->kv_ops,pbVar1->blksize
                            ,new_stale_root);
        btreeblk_end((btreeblk_handle *)handle->staletree->blk_handle);
      }
      else {
        handle->staletree = (btree *)0x0;
      }
      if (prev_filename != (char *)0x0) {
        free(prev_filename);
      }
      handle->dirty_updates = '\0';
      if (handle->kvs == (kvs_info *)0x0) {
        fVar4 = filemgr_get_seqnum(handle->file);
      }
      else {
        fVar4 = fdb_kvs_get_seqnum(handle->file,handle->kvs->id);
      }
      handle->seqnum = fVar4;
    }
    if (header_buf != (void *)0x0) {
      free(header_buf);
    }
  }
  return;
}

Assistant:

void fdb_sync_db_header(fdb_kvs_handle *handle)
{
    uint64_t cur_revnum = filemgr_get_header_revnum(handle->file);
    if (handle->cur_header_revnum != cur_revnum) {
        void *header_buf = NULL;
        size_t header_len;
        bid_t hdr_bid;
        filemgr_header_revnum_t revnum;

        header_buf = filemgr_get_header(handle->file, NULL, &header_len,
                                        &hdr_bid, NULL, &revnum);
        if (header_len > 0) {
            uint64_t header_flags, dummy64, version;
            bid_t idtree_root;
            bid_t new_seq_root;
            bid_t new_stale_root;
            char *compacted_filename;
            char *prev_filename = NULL;

            version = handle->file->version;
            atomic_store_uint64_t(&handle->last_hdr_bid, hdr_bid);
            handle->cur_header_revnum = revnum;

            fdb_fetch_header(version, header_buf, &idtree_root,
                             &new_seq_root, &new_stale_root, &dummy64,
                             &dummy64, &dummy64,
                             &dummy64, &handle->last_wal_flush_hdr_bid,
                             &handle->kv_info_offset, &header_flags,
                             &compacted_filename, &prev_filename);

            if (handle->dirty_updates) {
                // discard all cached writable b+tree nodes
                // to avoid data inconsistency with other writers
                btreeblk_discard_blocks(handle->bhandle);
            }

            handle->trie->root_bid = idtree_root;

            if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
                if (new_seq_root != handle->seqtree->root_bid) {
                    if (handle->config.multi_kv_instances) {
                        handle->seqtrie->root_bid = new_seq_root;
                    } else {
                        btree_init_from_bid(handle->seqtree,
                                            handle->seqtree->blk_handle,
                                            handle->seqtree->blk_ops,
                                            handle->seqtree->kv_ops,
                                            handle->seqtree->blksize,
                                            new_seq_root);
                    }
                }
            }

            if (ver_staletree_support(version)) {
                btree_init_from_bid(handle->staletree,
                                    handle->staletree->blk_handle,
                                    handle->staletree->blk_ops,
                                    handle->staletree->kv_ops,
                                    handle->staletree->blksize,
                                    new_stale_root);
                btreeblk_end((struct btreeblk_handle*)
                             handle->staletree->blk_handle);
            } else {
                handle->staletree = NULL;
            }

            if (prev_filename) {
                free(prev_filename);
            }

            handle->dirty_updates = 0;
            if (handle->kvs) {
                // multiple KV instance mode AND sub handle
                handle->seqnum = fdb_kvs_get_seqnum(handle->file,
                                                    handle->kvs->id);
            } else {
                // super handle OR single KV instance mode
                handle->seqnum = filemgr_get_seqnum(handle->file);
            }
        } else {
            atomic_store_uint64_t(&handle->last_hdr_bid,
                                  filemgr_get_header_bid(handle->file));
        }

        if (header_buf) {
            free(header_buf);
        }
    } else {
        if (handle == handle->fhandle->root) {
            // MB-20091: Commits use root handle that points to default kv store
            // The same default KV Store can have a different user-level handle.
            // To ensure that the root handle which will do the commit always
            // remains updated with the latest sequence number generated by the
            // user KVS Handle, we must always update the root handle's seqnum
            // even if there are no new commit headers to sync up in the file.
            handle->seqnum = filemgr_get_seqnum(handle->file);
        }
    }
}